

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void Map_DecreaseStorageKeysValues(MAP_HANDLE_DATA *handleData)

{
  size_t sVar1;
  bool bVar2;
  char **ppcVar3;
  LOGGER_LOG p_Var4;
  size_t __size;
  
  sVar1 = handleData->count;
  bVar2 = true;
  __size = 0xffffffffffffffff;
  if (sVar1 == 0) {
LAB_00138a88:
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                ,"Map_DecreaseStorageKeysValues",0xf0,1,
                "CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu",
                __size);
    }
    if (!bVar2) goto LAB_00138ac3;
  }
  else {
    if (sVar1 == 1) {
      free(handleData->keys);
      handleData->keys = (char **)0x0;
      free(handleData->values);
      handleData->values = (char **)0x0;
      handleData->count = 0;
      handleData->mapFilterCallback = (MAP_FILTER_CALLBACK)0x0;
      return;
    }
    if (sVar1 - 1 >> 0x3d != 0) goto LAB_00138a88;
    __size = sVar1 * 8 - 8;
    ppcVar3 = (char **)realloc(handleData->keys,__size);
    if (ppcVar3 == (char **)0x0) {
      bVar2 = false;
      goto LAB_00138a88;
    }
    handleData->keys = ppcVar3;
LAB_00138ac3:
    ppcVar3 = (char **)realloc(handleData->values,__size);
    if (ppcVar3 != (char **)0x0) {
      handleData->values = ppcVar3;
      goto LAB_00138b10;
    }
  }
  p_Var4 = xlogging_get_log_function();
  if (p_Var4 != (LOGGER_LOG)0x0) {
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
              ,"Map_DecreaseStorageKeysValues",0xfa,1,
              "CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu",
              __size);
  }
LAB_00138b10:
  handleData->count = handleData->count - 1;
  return;
}

Assistant:

static void Map_DecreaseStorageKeysValues(MAP_HANDLE_DATA* handleData)
{
    if (handleData->count == 1)
    {
        free(handleData->keys);
        handleData->keys = NULL;
        free(handleData->values);
        handleData->values = NULL;
        handleData->count = 0;
        handleData->mapFilterCallback = NULL;
    }
    else
    {
        /*certainly > 1...*/
        char** undoneValues;
        char** undoneKeys;
        size_t realloc_size = safe_subtract_size_t(handleData->count, 1);
        realloc_size = safe_multiply_size_t(realloc_size, sizeof(char*));

        if (realloc_size == SIZE_MAX ||
            (undoneKeys = (char**)realloc(handleData->keys, realloc_size)) == NULL)
        {
            LogError("CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu", realloc_size);
        }
        else
        {
            handleData->keys = undoneKeys;
        }

        if (realloc_size == SIZE_MAX || 
            (undoneValues = (char**)realloc(handleData->values, realloc_size)) == NULL)
        {
            LogError("CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu", realloc_size);
        }
        else
        {
            handleData->values = undoneValues;
        }

        handleData->count--;
    }
}